

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O0

Merge __thiscall Sector::add(Sector *this,Data *new_data,bool bad_crc,uint8_t new_dam)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  uchar *__s2;
  reference pvVar5;
  int *piVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  int local_154;
  Data *d;
  iterator __end2;
  iterator __begin2;
  vector<Data,_std::allocator<Data>_> *__range2;
  int local_100;
  int local_fc;
  const_iterator cStack_f8;
  int new_size;
  Data *local_f0;
  uchar *local_e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  const_iterator local_d0;
  Data *local_c8;
  uchar *local_c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a8;
  Data *data;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> local_98;
  iterator it;
  undefined1 local_88 [4];
  int complete_size;
  set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> local_58;
  Merge local_28;
  uint8_t local_22;
  byte local_21;
  Merge ret;
  uint8_t new_dam_local;
  bool bad_crc_local;
  Data *new_data_local;
  Sector *this_local;
  
  local_28 = NewData;
  local_22 = new_dam;
  local_21 = bad_crc;
  _ret = &new_data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  new_data_local = (Data *)this;
  bVar1 = has_badidcrc(this);
  if (bVar1) {
    this_local._4_4_ = Unchanged;
  }
  else if (((local_21 & 1) == 0) || (bVar1 = has_good_data(this), !bVar1)) {
    if (((local_21 & 1) == 0) && (bVar1 = has_baddatacrc(this), bVar1)) {
      remove_data(this);
      local_28 = Improved;
    }
    bVar1 = is_8k_sector(this);
    if (bVar1) {
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(_ret);
      iVar3 = Data::size((Data *)_ret);
      ChecksumMethods(&local_58,puVar4,iVar3);
      bVar1 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::empty
                        (&local_58);
      std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::~set
                (&local_58);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        iVar3 = copies(this);
        if (iVar3 == 1) {
          pvVar7 = &std::vector<Data,_std::allocator<Data>_>::operator[](&this->m_data,0)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar7);
          pvVar5 = std::vector<Data,_std::allocator<Data>_>::operator[](&this->m_data,0);
          iVar3 = Data::size(pvVar5);
          ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)local_88,puVar4,iVar3);
          bVar1 = std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::
                  empty((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *
                        )local_88);
          std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>::~set
                    ((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     local_88);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return Unchanged;
          }
        }
      }
      else {
        remove_data(this);
        local_28 = Improved;
      }
    }
    bVar1 = is_8k_sector(this);
    if (bVar1) {
      local_154 = 0x1800;
    }
    else {
      local_154 = Data::size((Data *)_ret);
    }
    it._M_current._4_4_ = local_154;
    local_98._M_current = (Data *)std::vector<Data,_std::allocator<Data>_>::begin(&this->m_data);
    while( true ) {
      data = (Data *)std::vector<Data,_std::allocator<Data>_>::end(&this->m_data);
      bVar1 = __gnu_cxx::operator!=
                        (&local_98,
                         (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                         &data);
      if (!bVar1) break;
      local_a8 = &__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
                  operator*(&local_98)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      iVar3 = Data::size((Data *)local_a8);
      if ((it._M_current._4_4_ <= iVar3) &&
         (iVar3 = Data::size((Data *)_ret), it._M_current._4_4_ <= iVar3)) {
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_a8);
        __s2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(_ret);
        iVar3 = memcmp(puVar4,__s2,(long)it._M_current._4_4_);
        if (iVar3 == 0) {
          return Unchanged;
        }
      }
      iVar3 = Data::size((Data *)local_a8);
      iVar2 = Data::size((Data *)_ret);
      if (iVar3 < iVar2) {
        local_d8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_a8);
        local_e0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_a8);
        local_e8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(_ret);
        bVar1 = std::
                equal<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_d8,local_e0,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_e8);
        if (bVar1) {
          iVar3 = Data::size((Data *)local_a8);
          if (it._M_current._4_4_ <= iVar3) {
            return Unchanged;
          }
          __gnu_cxx::__normal_iterator<Data_const*,std::vector<Data,std::allocator<Data>>>::
          __normal_iterator<Data*>
                    ((__normal_iterator<Data_const*,std::vector<Data,std::allocator<Data>>> *)
                     &stack0xffffffffffffff08,&local_98);
          local_f0 = (Data *)std::vector<Data,_std::allocator<Data>_>::erase
                                       (&this->m_data,cStack_f8);
          local_28 = Improved;
          local_98._M_current = local_f0;
        }
        else {
LAB_0022cc79:
          __gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
          operator++(&local_98);
        }
      }
      else {
        local_b0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(_ret);
        local_b8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(_ret);
        local_c0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      (local_a8);
        bVar1 = std::
                equal<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_b0,local_b8,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_c0);
        if (!bVar1) goto LAB_0022cc79;
        iVar3 = Data::size((Data *)local_a8);
        iVar2 = Data::size((Data *)_ret);
        if ((iVar3 == iVar2) || (iVar3 = Data::size((Data *)_ret), iVar3 < it._M_current._4_4_)) {
          return Unchanged;
        }
        __gnu_cxx::__normal_iterator<Data_const*,std::vector<Data,std::allocator<Data>>>::
        __normal_iterator<Data*>
                  ((__normal_iterator<Data_const*,std::vector<Data,std::allocator<Data>>> *)
                   &local_d0,&local_98);
        local_c8 = (Data *)std::vector<Data,_std::allocator<Data>_>::erase(&this->m_data,local_d0);
        local_28 = Improved;
        local_98._M_current = local_c8;
      }
    }
    iVar3 = copies(this);
    if (0 < iVar3) {
      if ((this->dam != local_22) &&
         ((this->dam == 0xfb || ((this->dam == 0xf8 && (local_22 != 0xfb)))))) {
        return Unchanged;
      }
      bVar1 = has_baddatacrc(this);
      if (!bVar1) {
        return Unchanged;
      }
      local_100 = Data::size((Data *)_ret);
      pvVar5 = std::vector<Data,_std::allocator<Data>_>::operator[](&this->m_data,0);
      __range2._4_4_ = Data::size(pvVar5);
      piVar6 = std::min<int>(&local_100,(int *)((long)&__range2 + 4));
      local_fc = *piVar6;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(_ret,(long)local_fc);
      __end2 = std::vector<Data,_std::allocator<Data>_>::begin(&this->m_data);
      d = (Data *)std::vector<Data,_std::allocator<Data>_>::end(&this->m_data);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>
                                         *)&d), bVar1) {
        pvVar7 = &__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
                  operator*(&__end2)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar7,(long)local_fc);
        __gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>::operator++
                  (&__end2);
      }
    }
    std::vector<Data,_std::allocator<Data>_>::emplace_back<Data>(&this->m_data,(Data *)_ret);
    limit_copies(this,opt.maxcopies);
    this->m_bad_data_crc = (bool)(local_21 & 1);
    this->dam = local_22;
    this_local._4_4_ = local_28;
  }
  else {
    this_local._4_4_ = Unchanged;
  }
  return this_local._4_4_;
}

Assistant:

Sector::Merge Sector::add(Data&& new_data, bool bad_crc, uint8_t new_dam)
{
    Merge ret = Merge::NewData;

    // If the sector has a bad header CRC, it can't have any data
    if (has_badidcrc())
        return Merge::Unchanged;

#ifdef _DEBUG
    // If there's enough data, check the CRC
    if ((encoding == Encoding::MFM || encoding == Encoding::FM) &&
        static_cast<int>(new_data.size()) >= (size() + 2))
    {
        CRC16 crc;
        if (encoding == Encoding::MFM) crc.init(CRC16::A1A1A1);
        crc.add(new_dam);
        auto bad_data_crc = crc.add(new_data.data(), size() + 2) != 0;
        assert(bad_crc == bad_data_crc);
    }
#endif

    // If the exising sector has good data, ignore supplied data if it's bad
    if (bad_crc && has_good_data())
        return Merge::Unchanged;

    // If the existing sector is bad, new good data will replace it all
    if (!bad_crc && has_baddatacrc())
    {
        remove_data();
        ret = Merge::Improved;
    }

    // 8K sectors always have a CRC error, but may include a secondary checksum
    if (is_8k_sector())
    {
        // Attempt to identify the 8K checksum method used by the new data
        // If it's recognised, replace any existing data with it
        if (!ChecksumMethods(new_data.data(), new_data.size()).empty())
        {
            remove_data();
            ret = Merge::Improved;
        }
        // Do we already have a copy?
        else if (copies() == 1)
        {
            // Can we identify the method used by the existing copy?
            if (!ChecksumMethods(m_data[0].data(), m_data[0].size()).empty())
            {
                // Keep the existing, ignoring the new data
                return Merge::Unchanged;
            }
        }
    }

    // DD 8K sectors are considered complete at 6K, everything else at natural size
    auto complete_size = is_8k_sector() ? 0x1800 : new_data.size();

    // Compare existing data with the new data, to avoid storing redundant copies.
    for (auto it = m_data.begin(); it != m_data.end(); )
    {
        auto& data = *it;

        if (data.size() >= complete_size && new_data.size() >= complete_size)
        {
            // If the complete area of the data matches, ignore the new copy.
            if (!std::memcmp(data.data(), new_data.data(), complete_size))
                return Merge::Unchanged;
        }

        // Existing data is the same size or larger?
        if (data.size() >= new_data.size())
        {
            // Compare the prefix of each.
            if (std::equal(new_data.begin(), new_data.end(), data.begin()))
            {
                // If identical, or new is shorter than complete size, ignore it.
                if (data.size() == new_data.size() || new_data.size() < complete_size)
                    return Merge::Unchanged;

                // The new shorter copy replaces the existing data.
                it = m_data.erase(it);
                ret = Merge::Improved;
                continue;
            }
        }
        else // existing is shorter
        {
            // Compare the prefix of each.
            if (std::equal(data.begin(), data.end(), new_data.begin()))
            {
                // If the existing data is at least complete size, ignore the new data.
                if (data.size() >= complete_size)
                    return Merge::Unchanged;

                // The new longer copy replaces the existing data.
                it = m_data.erase(it);
                ret = Merge::Improved;
                continue;
            }
        }

        ++it;
    }

    // Will we now have multiple copies?
    if (copies() > 0)
    {
        // Damage can cause us to see different DAM values for a sector.
        // Favour normal over deleted, and deleted over anything else.
        if (dam != new_dam &&
            (dam == 0xfb || (dam == 0xf8 && new_dam != 0xfb)))
        {
            return Merge::Unchanged;
        }

        // Multiple good copies mean a difference in the gap data after
        // a good sector, perhaps due to a splice. We just ignore it.
        if (!has_baddatacrc())
            return Merge::Unchanged;

        // Keep multiple copies the same size, whichever is shortest
        auto new_size = std::min(new_data.size(), m_data[0].size());
        new_data.resize(new_size);

        // Resize any existing copies to match
        for (auto& d : m_data)
            d.resize(new_size);
    }

    // Insert the new data copy.
    m_data.emplace_back(std::move(new_data));
    limit_copies(opt.maxcopies);

    // Update the data CRC state and DAM
    m_bad_data_crc = bad_crc;
    dam = new_dam;

    return ret;
}